

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_analysis.cc
# Opt level: O0

void __thiscall pass_check_function_return_Test::TestBody(pass_check_function_return_Test *this)

{
  bool bVar1;
  Generator *func_name;
  element_type *peVar2;
  element_type *peVar3;
  char *pcVar4;
  element_type *var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460;
  AssertHelper local_440;
  Message local_438 [6];
  exception *e_2;
  TrueWithString gtest_msg_2;
  shared_ptr<kratos::Var> local_3e0;
  undefined1 local_3d0 [32];
  undefined1 local_3b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  AssertHelper local_370;
  Message local_368 [6];
  exception *e_1;
  TrueWithString gtest_msg_1;
  shared_ptr<kratos::Var> local_310;
  undefined1 local_300 [32];
  AssertHelper local_2e0;
  Message local_2d8 [2];
  StmtException *anon_var_0;
  type e;
  undefined1 auStack_298 [7];
  bool gtest_caught_expected;
  TrueWithString gtest_msg;
  undefined1 local_268 [32];
  shared_ptr<kratos::Var> local_248;
  undefined1 local_238 [39];
  allocator<char> local_211;
  string local_210 [32];
  undefined1 local_1f0 [8];
  shared_ptr<kratos::Port> b;
  string local_1d8 [32];
  undefined1 local_1b8 [8];
  shared_ptr<kratos::Port> a;
  string local_1a0 [32];
  undefined1 local_180 [8];
  shared_ptr<kratos::FunctionStmtBlock> func;
  allocator<char> local_159;
  string local_158;
  undefined8 local_138;
  Generator *mod;
  Context c;
  pass_check_function_return_Test *this_local;
  
  c.tracked_generators_._M_h._M_single_bucket = (__node_base_ptr)this;
  kratos::Context::Context((Context *)&mod);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"mod",&local_159);
  func_name = kratos::Context::generator((Context *)&mod,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  local_138 = func_name;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1a0,"test_func",
             (allocator<char> *)
             ((long)&a.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi + 7));
  kratos::Generator::function((Generator *)local_180,(string *)func_name);
  std::__cxx11::string::~string(local_1a0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&a.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi + 7));
  peVar2 = std::
           __shared_ptr_access<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_180);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1d8,"a",
             (allocator<char> *)
             ((long)&b.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi + 7));
  (*(peVar2->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode[0xd])
            (local_1b8,peVar2,local_1d8,1,0);
  std::__cxx11::string::~string(local_1d8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&b.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi + 7));
  peVar2 = std::
           __shared_ptr_access<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_180);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_210,"b",&local_211);
  (*(peVar2->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode[0xd])
            (local_1f0,peVar2,local_210,1,0);
  std::__cxx11::string::~string(local_210);
  std::allocator<char>::~allocator(&local_211);
  peVar2 = std::
           __shared_ptr_access<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_180);
  peVar3 = std::
           __shared_ptr_access<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_180);
  std::shared_ptr<kratos::Var>::shared_ptr<kratos::Port,void>
            (&local_248,(shared_ptr<kratos::Port> *)local_1b8);
  kratos::FunctionStmtBlock::return_stmt
            ((FunctionStmtBlock *)local_238,(shared_ptr<kratos::Var> *)peVar3);
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::ReturnStmt,void>
            ((shared_ptr<kratos::Stmt> *)(local_238 + 0x10),
             (shared_ptr<kratos::ReturnStmt> *)local_238);
  kratos::StmtBlock::add_stmt
            (&peVar2->super_StmtBlock,(shared_ptr<kratos::Stmt> *)(local_238 + 0x10));
  std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)(local_238 + 0x10));
  std::shared_ptr<kratos::ReturnStmt>::~shared_ptr((shared_ptr<kratos::ReturnStmt> *)local_238);
  std::shared_ptr<kratos::Var>::~shared_ptr(&local_248);
  peVar2 = std::
           __shared_ptr_access<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_180);
  peVar3 = std::
           __shared_ptr_access<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_180);
  std::shared_ptr<kratos::Var>::shared_ptr<kratos::Port,void>
            ((shared_ptr<kratos::Var> *)((long)&gtest_msg.value.field_2 + 8),
             (shared_ptr<kratos::Port> *)local_1f0);
  kratos::FunctionStmtBlock::return_stmt
            ((FunctionStmtBlock *)local_268,(shared_ptr<kratos::Var> *)peVar3);
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::ReturnStmt,void>
            ((shared_ptr<kratos::Stmt> *)(local_268 + 0x10),
             (shared_ptr<kratos::ReturnStmt> *)local_268);
  kratos::StmtBlock::add_stmt
            (&peVar2->super_StmtBlock,(shared_ptr<kratos::Stmt> *)(local_268 + 0x10));
  std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)(local_268 + 0x10));
  std::shared_ptr<kratos::ReturnStmt>::~shared_ptr((shared_ptr<kratos::ReturnStmt> *)local_268);
  std::shared_ptr<kratos::Var>::~shared_ptr
            ((shared_ptr<kratos::Var> *)((long)&gtest_msg.value.field_2 + 8));
  gtest_msg.value._M_string_length = 0;
  gtest_msg.value.field_2._M_allocated_capacity = 0;
  _auStack_298 = (element_type *)0x0;
  gtest_msg.value._M_dataplus = (_Alloc_hider)0x0;
  gtest_msg.value._1_7_ = 0;
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)auStack_298);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)auStack_298);
  if (bVar1) {
    e._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      kratos::check_function_return((Generator *)local_138);
    }
    if ((e._7_1_ & 1) != 0) goto LAB_0013a643;
    std::__cxx11::string::operator=
              ((string *)auStack_298,
               "Expected: check_function_return(&mod) throws an exception of type StmtException.\n  Actual: it throws nothing."
              );
  }
  testing::Message::Message(local_2d8);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  testing::internal::AssertHelper::AssertHelper
            (&local_2e0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_analysis.cc"
             ,0x3c,pcVar4);
  testing::internal::AssertHelper::operator=(&local_2e0,local_2d8);
  testing::internal::AssertHelper::~AssertHelper(&local_2e0);
  testing::Message::~Message(local_2d8);
LAB_0013a643:
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)auStack_298);
  peVar2 = std::
           __shared_ptr_access<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_180);
  (*(peVar2->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode[0xc])();
  peVar2 = std::
           __shared_ptr_access<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_180);
  peVar3 = std::
           __shared_ptr_access<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_180);
  std::shared_ptr<kratos::Var>::shared_ptr<kratos::Port,void>
            (&local_310,(shared_ptr<kratos::Port> *)local_1b8);
  kratos::FunctionStmtBlock::return_stmt
            ((FunctionStmtBlock *)local_300,(shared_ptr<kratos::Var> *)peVar3);
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::ReturnStmt,void>
            ((shared_ptr<kratos::Stmt> *)(local_300 + 0x10),
             (shared_ptr<kratos::ReturnStmt> *)local_300);
  kratos::StmtBlock::add_stmt
            (&peVar2->super_StmtBlock,(shared_ptr<kratos::Stmt> *)(local_300 + 0x10));
  std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)(local_300 + 0x10));
  std::shared_ptr<kratos::ReturnStmt>::~shared_ptr((shared_ptr<kratos::ReturnStmt> *)local_300);
  std::shared_ptr<kratos::Var>::~shared_ptr(&local_310);
  gtest_msg_1.value._M_string_length = 0;
  gtest_msg_1.value.field_2._M_allocated_capacity = 0;
  e_1 = (exception *)0x0;
  gtest_msg_1.value._M_dataplus = (_Alloc_hider)0x0;
  gtest_msg_1.value._1_7_ = 0;
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)&e_1);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)&e_1);
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      kratos::check_function_return((Generator *)local_138);
    }
  }
  else {
    testing::Message::Message(local_368);
    std::operator+(&local_390,
                   "Expected: check_function_return(&mod) doesn\'t throw an exception.\n  Actual: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e_1);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_370,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_analysis.cc"
               ,0x40,pcVar4);
    testing::internal::AssertHelper::operator=(&local_370,local_368);
    testing::internal::AssertHelper::~AssertHelper(&local_370);
    std::__cxx11::string::~string((string *)&local_390);
    testing::Message::~Message(local_368);
  }
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)&e_1);
  peVar2 = std::
           __shared_ptr_access<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_180);
  (*(peVar2->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode[0xc])();
  peVar2 = std::
           __shared_ptr_access<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_180);
  var = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   local_1b8);
  kratos::constant(1,1,false);
  kratos::Var::assign((Var *)local_3b0,&var->super_Var);
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>
            ((shared_ptr<kratos::Stmt> *)(local_3b0 + 0x10),
             (shared_ptr<kratos::AssignStmt> *)local_3b0);
  kratos::StmtBlock::add_stmt
            (&peVar2->super_StmtBlock,(shared_ptr<kratos::Stmt> *)(local_3b0 + 0x10));
  std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)(local_3b0 + 0x10));
  std::shared_ptr<kratos::AssignStmt>::~shared_ptr((shared_ptr<kratos::AssignStmt> *)local_3b0);
  peVar2 = std::
           __shared_ptr_access<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_180);
  peVar3 = std::
           __shared_ptr_access<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_180);
  std::shared_ptr<kratos::Var>::shared_ptr<kratos::Port,void>
            (&local_3e0,(shared_ptr<kratos::Port> *)local_1f0);
  kratos::FunctionStmtBlock::return_stmt
            ((FunctionStmtBlock *)local_3d0,(shared_ptr<kratos::Var> *)peVar3);
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::ReturnStmt,void>
            ((shared_ptr<kratos::Stmt> *)(local_3d0 + 0x10),
             (shared_ptr<kratos::ReturnStmt> *)local_3d0);
  kratos::StmtBlock::add_stmt
            (&peVar2->super_StmtBlock,(shared_ptr<kratos::Stmt> *)(local_3d0 + 0x10));
  std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)(local_3d0 + 0x10));
  std::shared_ptr<kratos::ReturnStmt>::~shared_ptr((shared_ptr<kratos::ReturnStmt> *)local_3d0);
  std::shared_ptr<kratos::Var>::~shared_ptr(&local_3e0);
  gtest_msg_2.value._M_string_length = 0;
  gtest_msg_2.value.field_2._M_allocated_capacity = 0;
  e_2 = (exception *)0x0;
  gtest_msg_2.value._M_dataplus = (_Alloc_hider)0x0;
  gtest_msg_2.value._1_7_ = 0;
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)&e_2);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)&e_2);
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      kratos::check_function_return((Generator *)local_138);
    }
  }
  else {
    testing::Message::Message(local_438);
    std::operator+(&local_460,
                   "Expected: check_function_return(&mod) doesn\'t throw an exception.\n  Actual: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e_2);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_440,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_analysis.cc"
               ,0x45,pcVar4);
    testing::internal::AssertHelper::operator=(&local_440,local_438);
    testing::internal::AssertHelper::~AssertHelper(&local_440);
    std::__cxx11::string::~string((string *)&local_460);
    testing::Message::~Message(local_438);
  }
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)&e_2);
  std::shared_ptr<kratos::Port>::~shared_ptr((shared_ptr<kratos::Port> *)local_1f0);
  std::shared_ptr<kratos::Port>::~shared_ptr((shared_ptr<kratos::Port> *)local_1b8);
  std::shared_ptr<kratos::FunctionStmtBlock>::~shared_ptr
            ((shared_ptr<kratos::FunctionStmtBlock> *)local_180);
  kratos::Context::~Context((Context *)&mod);
  return;
}

Assistant:

TEST(pass, check_function_return) {  // NOLINT
    Context c;
    auto &mod = c.generator("mod");
    auto func = mod.function("test_func");
    auto a = func->input("a", 1, false);
    auto b = func->input("b", 1, false);
    func->add_stmt(func->return_stmt(a));
    func->add_stmt(func->return_stmt(b));

    EXPECT_THROW(check_function_return(&mod), StmtException);
    // clear the statements
    func->clear();
    func->add_stmt(func->return_stmt(a));
    EXPECT_NO_THROW(check_function_return(&mod));
    // clear the statements
    func->clear();
    func->add_stmt(a->assign(constant(1, 1)));
    func->add_stmt(func->return_stmt(b));
    EXPECT_NO_THROW(check_function_return(&mod));
}